

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

string * deqp::gls::ShaderExecUtil::generateGeometryShader
                   (string *__return_storage_ptr__,ShaderSpec *shaderSpec,string *inputPrefix,
                   string *outputPrefix)

{
  bool bVar1;
  DataType DVar2;
  int vecSize_00;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer pSVar6;
  istream *piVar7;
  pointer pSVar8;
  DataType local_6b4;
  DataType local_5d4;
  DataType intBaseType_1;
  int vecSize_1;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_558;
  const_iterator output_2;
  string line;
  istringstream opSrc;
  DeclareVariable local_3b0;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_370;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_368;
  const_iterator output_1;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_320;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_318;
  const_iterator input_1;
  DeclareVariable local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  DeclareVariable local_290;
  undefined1 local_250 [8];
  VarType intType;
  DataType intBaseType;
  int vecSize;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_228;
  const_iterator output;
  DeclareVariable local_200;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_1c0;
  __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
  local_1b8;
  const_iterator input;
  ostringstream local_1a0 [8];
  ostringstream src;
  string *outputPrefix_local;
  string *inputPrefix_local;
  ShaderSpec *shaderSpec_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar3 = glu::getGLSLVersionDeclaration(shaderSpec->version);
  poVar4 = std::operator<<((ostream *)local_1a0,pcVar3);
  std::operator<<(poVar4,"\n");
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  if ((bVar1) && ((int)shaderSpec->version < 3)) {
    std::operator<<((ostream *)local_1a0,"#extension GL_EXT_geometry_shader : require\n");
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_1a0,(string *)&shaderSpec->globalDeclarations);
    std::operator<<(poVar4,"\n");
  }
  poVar4 = std::operator<<((ostream *)local_1a0,"layout(points) in;\n");
  std::operator<<(poVar4,"layout(points, max_vertices = 1) out;\n");
  local_1b8._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->inputs);
  while( true ) {
    local_1c0._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_1b8,&local_1c0);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"flat in ");
    pSVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_1b8);
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_1b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                   inputPrefix,&pSVar6->name);
    glu::declare(&local_200,&pSVar8->varType,(string *)&output,0);
    poVar4 = glu::decl::operator<<(poVar4,&local_200);
    std::operator<<(poVar4,"[];\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_200);
    std::__cxx11::string::~string((string *)&output);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_1b8);
  }
  local_228._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->outputs);
  while( true ) {
    _intBaseType = std::
                   vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                   ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_228,
                       (__normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                        *)&intBaseType);
    if (!bVar1) break;
    pSVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_228);
    DVar2 = glu::VarType::getBasicType(&pSVar8->varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_228);
      DVar2 = glu::VarType::getBasicType(&pSVar8->varType);
      intType.m_data._12_4_ = glu::getDataTypeScalarSize(DVar2);
      if ((int)intType.m_data._12_4_ < 2) {
        local_5d4 = TYPE_INT;
      }
      else {
        local_5d4 = glu::getDataTypeIntVec(intType.m_data._12_4_);
      }
      intType.m_data.array.size = local_5d4;
      glu::VarType::VarType((VarType *)local_250,local_5d4,PRECISION_HIGHP);
      poVar4 = std::operator<<((ostream *)local_1a0,"flat out ");
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_228);
      std::operator+(&local_2b0,outputPrefix,&pSVar8->name);
      glu::declare(&local_290,(VarType *)local_250,&local_2b0,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_290);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      glu::VarType::~VarType((VarType *)local_250);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1a0,"flat out ");
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_228);
      pSVar6 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_228);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input_1,
                     outputPrefix,&pSVar6->name);
      glu::declare(&local_2f0,&pSVar8->varType,(string *)&input_1,0);
      poVar4 = glu::decl::operator<<(poVar4,&local_2f0);
      std::operator<<(poVar4,";\n");
      glu::decl::DeclareVariable::~DeclareVariable(&local_2f0);
      std::__cxx11::string::~string((string *)&input_1);
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_228);
  }
  poVar4 = std::operator<<((ostream *)local_1a0,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  std::operator<<(poVar4,"\tgl_Position = gl_in[0].gl_Position;\n\n");
  local_318._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->inputs);
  while( true ) {
    local_320._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->inputs);
    bVar1 = __gnu_cxx::operator!=(&local_318,&local_320);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"\t");
    pSVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_318);
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_318);
    glu::declare((DeclareVariable *)&output_1,&pSVar8->varType,&pSVar6->name,0);
    poVar4 = glu::decl::operator<<(poVar4,(DeclareVariable *)&output_1);
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = std::operator<<(poVar4,(string *)inputPrefix);
    pSVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_318);
    poVar4 = std::operator<<(poVar4,(string *)pSVar8);
    std::operator<<(poVar4,"[0];\n");
    glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&output_1);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_318);
  }
  local_368._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->outputs);
  while( true ) {
    local_370._M_current =
         (Symbol *)
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=(&local_368,&local_370);
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"\t");
    pSVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_368);
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_368);
    glu::declare(&local_3b0,&pSVar8->varType,&pSVar6->name,0);
    poVar4 = glu::decl::operator<<(poVar4,&local_3b0);
    std::operator<<(poVar4,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_3b0);
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_368);
  }
  std::operator<<((ostream *)local_1a0,"\n");
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(line.field_2._M_local_buf + 8),(string *)&shaderSpec->source,_S_in);
  std::__cxx11::string::string((string *)&output_2);
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),(string *)&output_2);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar1) break;
    poVar4 = std::operator<<((ostream *)local_1a0,"\t");
    poVar4 = std::operator<<(poVar4,(string *)&output_2);
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::~string((string *)&output_2);
  std::__cxx11::istringstream::~istringstream((istringstream *)(line.field_2._M_local_buf + 8));
  local_558._M_current =
       (Symbol *)
       std::
       vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
       ::begin(&shaderSpec->outputs);
  while( true ) {
    _intBaseType_1 =
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::end(&shaderSpec->outputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_558,
                       (__normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
                        *)&intBaseType_1);
    if (!bVar1) break;
    pSVar8 = __gnu_cxx::
             __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
             ::operator->(&local_558);
    DVar2 = glu::VarType::getBasicType(&pSVar8->varType);
    bVar1 = glu::isDataTypeBoolOrBVec(DVar2);
    if (bVar1) {
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_558);
      DVar2 = glu::VarType::getBasicType(&pSVar8->varType);
      vecSize_00 = glu::getDataTypeScalarSize(DVar2);
      if (vecSize_00 < 2) {
        local_6b4 = TYPE_INT;
      }
      else {
        local_6b4 = glu::getDataTypeIntVec(vecSize_00);
      }
      poVar4 = std::operator<<((ostream *)local_1a0,"\t");
      poVar4 = std::operator<<(poVar4,(string *)outputPrefix);
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar8);
      poVar4 = std::operator<<(poVar4," = ");
      pcVar3 = glu::getDataTypeName(local_6b4);
      poVar4 = std::operator<<(poVar4,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar8);
      std::operator<<(poVar4,");\n");
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1a0,"\t");
      poVar4 = std::operator<<(poVar4,(string *)outputPrefix);
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar8);
      poVar4 = std::operator<<(poVar4," = ");
      pSVar8 = __gnu_cxx::
               __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
               ::operator->(&local_558);
      poVar4 = std::operator<<(poVar4,(string *)pSVar8);
      std::operator<<(poVar4,";\n");
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>_>
    ::operator++(&local_558);
  }
  poVar4 = std::operator<<((ostream *)local_1a0,"\tEmitVertex();\n");
  poVar4 = std::operator<<(poVar4,"\tEndPrimitive();\n");
  std::operator<<(poVar4,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateGeometryShader (const ShaderSpec& shaderSpec, const std::string& inputPrefix, const std::string& outputPrefix)
{
	DE_ASSERT(glu::glslVersionUsesInOutQualifiers(shaderSpec.version));
	DE_ASSERT(!inputPrefix.empty() && !outputPrefix.empty());

	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(shaderSpec.version) << "\n";

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		src << "#extension GL_EXT_geometry_shader : require\n";

	if (!shaderSpec.globalDeclarations.empty())
		src << shaderSpec.globalDeclarations << "\n";

	src << "layout(points) in;\n"
		<< "layout(points, max_vertices = 1) out;\n";

	for (vector<Symbol>::const_iterator input = shaderSpec.inputs.begin(); input != shaderSpec.inputs.end(); ++input)
		src << "flat in " << glu::declare(input->varType, inputPrefix + input->name) << "[];\n";

	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		DE_ASSERT(output->varType.isBasicType());

		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType		intType		(intBaseType, glu::PRECISION_HIGHP);

			src << "flat out " << glu::declare(intType, outputPrefix + output->name) << ";\n";
		}
		else
			src << "flat out " << glu::declare(output->varType, outputPrefix + output->name) << ";\n";
	}

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = gl_in[0].gl_Position;\n\n";

	// Fetch input variables
	for (vector<Symbol>::const_iterator input = shaderSpec.inputs.begin(); input != shaderSpec.inputs.end(); ++input)
		src << "\t" << glu::declare(input->varType, input->name) << " = " << inputPrefix << input->name << "[0];\n";

	// Declare local output variables.
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
		src << "\t" << glu::declare(output->varType, output->name) << ";\n";

	src << "\n";

	// Operation - indented to correct level.
	{
		std::istringstream	opSrc	(shaderSpec.source);
		std::string			line;

		while (std::getline(opSrc, line))
			src << "\t" << line << "\n";
	}

	// Assignments to outputs.
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

			src << "\t" << outputPrefix << output->name << " = " << glu::getDataTypeName(intBaseType) << "(" << output->name << ");\n";
		}
		else
			src << "\t" << outputPrefix << output->name << " = " << output->name << ";\n";
	}

	src << "	EmitVertex();\n"
		<< "	EndPrimitive();\n"
		<< "}\n";

	return src.str();
}